

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolHash.c
# Opt level: O3

deBool deTestHash_copyToArray
                 (deTestHash *hash,deTestInt16Array *keyArray,deTestIntArray *valueArray)

{
  deTestHashSlot **ppdVar1;
  deBool dVar2;
  long lVar3;
  int iVar4;
  deTestHashSlot *pdVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  
  iVar6 = hash->numElements;
  if (keyArray == (deTestInt16Array *)0x0) {
LAB_002165df:
    if (valueArray != (deTestIntArray *)0x0) {
      if (valueArray->capacity < iVar6) {
        dVar2 = dePoolArray_setSize((dePoolArray *)valueArray,iVar6);
        if (dVar2 == 0) goto LAB_002165fb;
      }
      else {
        valueArray->numElements = iVar6;
      }
    }
    iVar6 = hash->slotTableSize;
    dVar2 = 1;
    if (0 < iVar6) {
      ppdVar1 = hash->slotTable;
      lVar3 = 0;
      iVar4 = 0;
      do {
        pdVar5 = ppdVar1[lVar3];
        if (pdVar5 != (deTestHashSlot *)0x0) {
          do {
            iVar6 = pdVar5->numUsed;
            if (0 < iVar6) {
              lVar7 = 0;
              do {
                uVar8 = iVar4 + (int)lVar7;
                if (keyArray != (deTestInt16Array *)0x0) {
                  keyArray->pageTable[(int)uVar8 >> 4][uVar8 & 0xf] = pdVar5->keys[lVar7];
                }
                if (valueArray != (deTestIntArray *)0x0) {
                  valueArray->pageTable[(int)uVar8 >> 4][uVar8 & 0xf] = pdVar5->values[lVar7];
                  iVar6 = pdVar5->numUsed;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 < iVar6);
              iVar4 = iVar4 + (int)lVar7;
            }
            pdVar5 = pdVar5->nextSlot;
          } while (pdVar5 != (deTestHashSlot *)0x0);
          iVar6 = hash->slotTableSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar6);
    }
  }
  else {
    if (iVar6 <= keyArray->capacity) {
      keyArray->numElements = iVar6;
      goto LAB_002165df;
    }
    dVar2 = dePoolArray_setSize((dePoolArray *)keyArray,iVar6);
    if (dVar2 != 0) goto LAB_002165df;
LAB_002165fb:
    dVar2 = 0;
  }
  return dVar2;
}

Assistant:

void dePoolHash_selfTest (void)
{
	deMemPool*	pool	= deMemPool_createRoot(DE_NULL, 0);
	deTestHash*	hash	= deTestHash_create(pool);
	int			iter;

	for (iter = 0; iter < 3; iter++)
	{
		int i;

		/* Test find() on empty hash. */
		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 0);
		for (i = 0; i < 15000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			DE_TEST_ASSERT(!val);
		}

		/* Test insert(). */
		for (i = 0; i < 5000; i++)
		{
			deTestHash_insert(hash, (deInt16)i, -i);
		}

		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 5000);
		for (i = 0; i < 5000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			DE_TEST_ASSERT(val && (*val == -i));
		}

		/* Test delete(). */
		for (i = 0; i < 1000; i++)
			deTestHash_delete(hash, (deInt16)i);

		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 4000);
		for (i = 0; i < 25000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			if (deInBounds32(i, 1000, 5000))
				DE_TEST_ASSERT(val && (*val == -i));
			else
				DE_TEST_ASSERT(!val);
		}

		/* Test insert() after delete(). */
		for (i = 10000; i < 12000; i++)
			deTestHash_insert(hash, (deInt16)i, -i);

		for (i = 0; i < 25000; i++)
		{
			const int* val = deTestHash_find(hash, (deInt16)i);
			if (deInBounds32(i, 1000, 5000) || deInBounds32(i, 10000, 12000))
				DE_TEST_ASSERT(val && (*val == -i));
			else
				DE_TEST_ASSERT(!val);
		}

		/* Test iterator. */
		{
			deTestHashIter	testIter;
			int				numFound = 0;

			for (deTestHashIter_init(hash, &testIter); deTestHashIter_hasItem(&testIter); deTestHashIter_next(&testIter))
			{
				deInt16	key	= deTestHashIter_getKey(&testIter);
				int		val	= deTestHashIter_getValue(&testIter);
				DE_TEST_ASSERT(deInBounds32(key, 1000, 5000) || deInBounds32(key, 10000, 12000));
				DE_TEST_ASSERT(*deTestHash_find(hash, key) == -key);
				DE_TEST_ASSERT(val == -key);
				numFound++;
			}

			DE_TEST_ASSERT(numFound == deTestHash_getNumElements(hash));
		}

		/* Test copy-to-array. */
		{
			deTestInt16Array*	keyArray	= deTestInt16Array_create(pool);
			deTestIntArray*		valueArray	= deTestIntArray_create(pool);
			int					numElements	= deTestHash_getNumElements(hash);
			int					ndx;

			deTestHash_copyToArray(hash, keyArray, DE_NULL);
			DE_TEST_ASSERT(deTestInt16Array_getNumElements(keyArray) == numElements);

			deTestHash_copyToArray(hash, DE_NULL, valueArray);
			DE_TEST_ASSERT(deTestIntArray_getNumElements(valueArray) == numElements);

			deTestInt16Array_setSize(keyArray, 0);
			deTestIntArray_setSize(valueArray, 0);
			deTestHash_copyToArray(hash, keyArray, valueArray);
			DE_TEST_ASSERT(deTestInt16Array_getNumElements(keyArray) == numElements);
			DE_TEST_ASSERT(deTestIntArray_getNumElements(valueArray) == numElements);

			for (ndx = 0; ndx < numElements; ndx++)
			{
				deInt16 key = deTestInt16Array_get(keyArray, ndx);
				int		val = deTestIntArray_get(valueArray, ndx);

				DE_TEST_ASSERT(val == -key);
				DE_TEST_ASSERT(*deTestHash_find(hash, key) == val);
			}
		}

		/* Test reset(). */
		deTestHash_reset(hash);
		DE_TEST_ASSERT(deTestHash_getNumElements(hash) == 0);
	}

	deMemPool_destroy(pool);
}